

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_rayquery_function
          (CompilerHLSL *this,char *commited,char *candidate,uint32_t *ops)

{
  uint32_t result_type;
  uint32_t result_id;
  uint32_t uVar1;
  char **ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  undefined1 local_80 [24];
  char local_68 [16];
  undefined1 local_58 [24];
  char local_40 [16];
  
  local_80._0_8_ = candidate;
  local_58._0_8_ = commited;
  CompilerGLSL::flush_variable_declaration(&this->super_CompilerGLSL,*ops);
  uVar1 = Compiler::evaluate_constant_u32((Compiler *)this,ops[3]);
  result_type = *ops;
  result_id = ops[1];
  ts_1 = (char **)0x1;
  CompilerGLSL::to_expression_abi_cxx11_
            ((string *)(local_58 + 8),&this->super_CompilerGLSL,ops[2],true);
  ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  if (uVar1 == 0) {
    ts = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  }
  join<std::__cxx11::string,char_const*&>
            ((string *)(local_80 + 8),(spirv_cross *)(local_58 + 8),ts,ts_1);
  CompilerGLSL::emit_op
            (&this->super_CompilerGLSL,result_type,result_id,(string *)(local_80 + 8),false,false);
  if ((char *)local_80._8_8_ != local_68) {
    operator_delete((void *)local_80._8_8_);
  }
  if ((char *)local_58._8_8_ != local_40) {
    operator_delete((void *)local_58._8_8_);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_rayquery_function(const char *commited, const char *candidate, const uint32_t *ops)
{
	flush_variable_declaration(ops[0]);
	uint32_t is_commited = evaluate_constant_u32(ops[3]);
	emit_op(ops[0], ops[1], join(to_expression(ops[2]), is_commited ? commited : candidate), false);
}